

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O3

int Aig_TsiStateCount(Aig_Tsi_t *p,uint *pState)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pAVar1 = p->pAig;
  if (pAVar1->nRegs < 1) {
    iVar2 = 0;
  }
  else {
    iVar4 = -pAVar1->nRegs;
    uVar5 = 0;
    iVar2 = 0;
    uVar6 = 0;
    do {
      iVar3 = pAVar1->nObjs[3] + iVar4;
      if ((((iVar3 < 0) || (pAVar1->vCos->nSize <= iVar3)) ||
          (iVar3 = pAVar1->nObjs[2] + iVar4, iVar3 < 0)) || (pAVar1->vCis->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = iVar2 + (uint)(((uint)((pState[uVar6 >> 4] >> (uVar5 & 0x1e) & 1) != 0) +
                             (pState[uVar6 >> 4] >> (((byte)uVar5 & 0x1e) + 1 & 0x1f) & 1) * 2) - 1
                            < 2);
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 2;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  return iVar2;
}

Assistant:

int Aig_TsiStateCount( Aig_Tsi_t * p, unsigned * pState )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, Value, nCounter = 0;
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
    }
    return nCounter;
}